

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

string_view __thiscall chain::str::trim_right_view(str *this,string_view data)

{
  undefined1 auVar1 [16];
  int iVar2;
  char *pcVar3;
  str *__n;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view sVar5;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  pcVar3 = (char *)data._M_len;
  local_28._M_len = (size_t)this;
  local_28._M_str = pcVar3;
  if (this == (str *)0x0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pcVar3;
    bVar4 = (basic_string_view<char,_std::char_traits<char>_>)(auVar1 << 0x40);
  }
  else {
    do {
      __n = this;
      if ((long)(__n + -1) < 0) break;
      iVar2 = isspace((uint)(byte)(pcVar3 + -1)[(long)__n]);
      this = __n + -1;
    } while (iVar2 != 0);
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_28,0,(size_type)__n);
  }
  sVar5._M_len = bVar4._M_len;
  sVar5._M_str = bVar4._M_str;
  return sVar5;
}

Assistant:

auto trim_right_view(std::string_view data) -> std::string_view
{
    if (!data.empty())
    {
        int64_t index = static_cast<int64_t>(data.length() - 1);
        while (index >= 0)
        {
            if (!std::isspace(static_cast<unsigned char>(data[static_cast<std::size_t>(index)])))
            {
                break;
            }
            else
            {
                --index;
            }
        }

        data = data.substr(0, static_cast<std::size_t>(index + 1));
    }

    return data;
}